

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NtpClient.h
# Opt level: O3

void __thiscall NtpClient::readPendingDatagrams(NtpClient *this)

{
  undefined8 uVar1;
  char cVar2;
  ulong uVar3;
  long lVar4;
  undefined8 *puVar5;
  NtpReply *pNVar6;
  byte bVar7;
  quint16 port;
  QHostAddress address;
  NtpFullPacket packet;
  quint16 local_12a;
  QDateTime local_128 [8];
  QHostAddress local_120 [8];
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  NtpReply local_c8;
  undefined8 local_78 [8];
  quint8 local_38 [8];
  
  bVar7 = 0;
  cVar2 = QUdpSocket::hasPendingDatagrams();
  if (cVar2 != '\0') {
    do {
      local_e8 = 0;
      uStack_e0 = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      local_108 = 0;
      uStack_100 = 0;
      local_118 = 0;
      uStack_110 = 0;
      local_d8 = 0;
      QHostAddress::QHostAddress(local_120);
      uVar3 = QUdpSocket::readDatagram
                        ((char *)(this->m_socket)._M_t.
                                 super___uniq_ptr_impl<QUdpSocket,_std::default_delete<QUdpSocket>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_QUdpSocket_*,_std::default_delete<QUdpSocket>_>
                                 .super__Head_base<0UL,_QUdpSocket_*,_false>._M_head_impl,
                         (longlong)&local_118,(QHostAddress *)0x44,(ushort *)local_120);
      if (0x2f < uVar3) {
        memcpy(local_78,&local_118,0x44);
        QDateTime::currentDateTime();
        puVar5 = local_78;
        pNVar6 = &local_c8;
        for (lVar4 = 8; lVar4 != 0; lVar4 = lVar4 + -1) {
          uVar1 = *puVar5;
          (pNVar6->m_packet).basic.flags = (NtpPacketFlags)(char)uVar1;
          (pNVar6->m_packet).basic.stratum = (char)((ulong)uVar1 >> 8);
          (pNVar6->m_packet).basic.poll = (char)((ulong)uVar1 >> 0x10);
          (pNVar6->m_packet).basic.precision = (char)((ulong)uVar1 >> 0x18);
          (pNVar6->m_packet).basic.rootDelay = (int)((ulong)uVar1 >> 0x20);
          puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
          pNVar6 = (NtpReply *)((long)pNVar6 + ((ulong)bVar7 * -2 + 1) * 8);
        }
        local_c8.m_packet.auth.messageDigest[0xc] = local_38[0];
        local_c8.m_packet.auth.messageDigest[0xd] = local_38[1];
        local_c8.m_packet.auth.messageDigest[0xe] = local_38[2];
        local_c8.m_packet.auth.messageDigest[0xf] = local_38[3];
        QDateTime::QDateTime(&local_c8.m_destinationTime,local_128);
        replyReceived(this,local_120,local_12a,&local_c8);
        QDateTime::~QDateTime(&local_c8.m_destinationTime);
        QDateTime::~QDateTime(local_128);
      }
      QHostAddress::~QHostAddress(local_120);
      cVar2 = QUdpSocket::hasPendingDatagrams();
    } while (cVar2 != '\0');
  }
  return;
}

Assistant:

void readPendingDatagrams() {
        while (m_socket->hasPendingDatagrams()) {
            NtpFullPacket packet;
            memset(&packet, 0, sizeof(packet));

            QHostAddress address;
            quint16 port;
            if (m_socket->readDatagram(reinterpret_cast<char *>(&packet), sizeof(packet), &address, &port) < sizeof(NtpPacket))
                continue;

            Q_EMIT replyReceived(address, port, NtpReply(packet, QDateTime::currentDateTime()));
        }
    }